

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegtexture.cpp
# Opt level: O3

void __thiscall FJPEGTexture::FJPEGTexture(FJPEGTexture *this,int lumpnum,int width,int height)

{
  undefined1 *puVar1;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,lumpnum);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FJPEGTexture_0088c820;
  this->Pixels = (BYTE *)0x0;
  (this->super_FTexture).UseType = '\b';
  (this->super_FTexture).LeftOffset = 0;
  (this->super_FTexture).TopOffset = 0;
  puVar1 = &(this->super_FTexture).field_0x31;
  *puVar1 = *puVar1 & 0xf7;
  (this->super_FTexture).Width = (WORD)width;
  (this->super_FTexture).Height = (WORD)height;
  FTexture::CalcBitSize(&this->super_FTexture);
  this->DummySpans[0].TopOffset = 0;
  this->DummySpans[0].Length = (this->super_FTexture).Height;
  this->DummySpans[1].TopOffset = 0;
  this->DummySpans[1].Length = 0;
  return;
}

Assistant:

FJPEGTexture::FJPEGTexture (int lumpnum, int width, int height)
: FTexture(NULL, lumpnum), Pixels(0)
{
	UseType = TEX_MiscPatch;
	LeftOffset = 0;
	TopOffset = 0;
	bMasked = false;

	Width = width;
	Height = height;
	CalcBitSize ();

	DummySpans[0].TopOffset = 0;
	DummySpans[0].Length = Height;
	DummySpans[1].TopOffset = 0;
	DummySpans[1].Length = 0;
}